

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::Executor::Impl::disconnect(Impl *this)

{
  bool bVar1;
  State *this_00;
  XThreadEvent *__filename;
  XThreadPaf *__filename_00;
  XThreadPaf *event_4;
  Iterator __end3_1;
  Iterator __begin3_1;
  List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *__range3_1;
  bool _kj_shouldLog_1;
  XThreadEvent *event_3;
  Iterator __end3;
  Iterator __begin3;
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink> *__range3;
  bool _kj_shouldLog;
  Fault local_1c8;
  Fault f_2;
  Type *local_1b8;
  undefined1 local_1b0 [8];
  DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
  _kjCondition_2;
  XThreadEvent *event_2;
  Iterator __end2_2;
  Iterator __begin2_2;
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *__range2_2;
  Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_150;
  Fault local_148;
  Fault f_1;
  Type *local_138;
  undefined1 local_130 [8];
  DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
  _kjCondition_1;
  XThreadEvent *event_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *__range2_1;
  Fault f;
  Type *local_c8;
  undefined1 local_c0 [8];
  DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
  _kjCondition;
  XThreadEvent *event;
  Iterator __end2;
  Iterator __begin2;
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *__range2;
  undefined1 local_60 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:848:5)>
  _kjDefer848;
  State *s;
  Maybe<kj::_::XThreadEvent_&> local_10;
  Impl *this_local;
  
  local_10.ptr = (XThreadEvent *)this;
  Maybe<kj::EventLoop_&>::Maybe((Maybe<kj::EventLoop_&> *)&stack0xffffffffffffffe8);
  MutexGuarded<kj::Executor::Impl::State>::lockExclusive
            ((MutexGuarded<kj::Executor::Impl::State> *)&stack0xffffffffffffffd0,this);
  this_00 = Locked<kj::Executor::Impl::State>::operator->
                      ((Locked<kj::Executor::Impl::State> *)&stack0xffffffffffffffd0);
  Maybe<kj::EventLoop_&>::operator=
            (&this_00->loop,(Maybe<kj::EventLoop_&> *)&stack0xffffffffffffffe8);
  Locked<kj::Executor::Impl::State>::~Locked
            ((Locked<kj::Executor::Impl::State> *)&stack0xffffffffffffffd0);
  _kjDefer848.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:848:5)>_2
        )MutexGuarded<kj::Executor::Impl::State>::getWithoutLock(&this->state);
  __range2 = (List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)this;
  defer<kj::Executor::Impl::disconnect()::_lambda()_1_>((kj *)local_60,(Type *)&__range2);
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::begin
            ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)&__end2.next);
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::end
            ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)&event);
  while (bVar1 = ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                 ::operator==((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                               *)&__end2.next,
                              (ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                               *)&event), ((bVar1 ^ 0xffU) & 1) != 0) {
    _kjCondition._32_8_ =
         ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::
         operator*((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                    *)&__end2.next);
    local_c8 = (Type *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                  &((XThreadEvent *)_kjCondition._32_8_)->state);
    f.exception._4_4_ = 1;
    kj::_::DebugExpression<kj::_::XThreadEvent::{unnamed_type#1}&>::operator==
              ((DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
                *)local_c0,(DebugExpression<kj::_::XThreadEvent::_unnamed_type_1_&> *)&local_c8,
               (Type *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadEvent::_unnamed_type_1_&,_unnamed_type_1_>&,kj::_::XThreadEvent::_unnamed_type_1_>
                ((Fault *)&__range2_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x353,FAILED,"event.state == _::XThreadEvent::QUEUED","_kjCondition,event.state",
                 (DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
                  *)local_c0,(Type *)(_kjCondition._32_8_ + 0x90));
      kj::_::Debug::Fault::~Fault((Fault *)&__range2_1);
    }
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
              ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
               ((long)_kjDefer848.maybeFunc.ptr.field_1 + 8),(char *)_kjCondition._32_8_);
    kj::_::XThreadEvent::setDisconnected((XThreadEvent *)_kjCondition._32_8_);
    kj::_::XThreadEvent::sendReply((XThreadEvent *)_kjCondition._32_8_);
    kj::_::XThreadEvent::setDoneState((XThreadEvent *)_kjCondition._32_8_);
    ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::
    operator++((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                *)&__end2.next);
  }
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::begin
            ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)&__end2_1.next);
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::end
            ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)&event_1);
  while (bVar1 = ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                 ::operator==((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                               *)&__end2_1.next,
                              (ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                               *)&event_1), ((bVar1 ^ 0xffU) & 1) != 0) {
    _kjCondition_1._32_8_ =
         ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::
         operator*((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                    *)&__end2_1.next);
    local_138 = (Type *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                   &((XThreadEvent *)_kjCondition_1._32_8_)->state);
    f_1.exception._4_4_ = 2;
    kj::_::DebugExpression<kj::_::XThreadEvent::{unnamed_type#1}&>::operator==
              ((DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
                *)local_130,(DebugExpression<kj::_::XThreadEvent::_unnamed_type_1_&> *)&local_138,
               (Type *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_130);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadEvent::_unnamed_type_1_&,_unnamed_type_1_>&,kj::_::XThreadEvent::_unnamed_type_1_>
                (&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x35b,FAILED,"event.state == _::XThreadEvent::EXECUTING",
                 "_kjCondition,event.state",
                 (DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
                  *)local_130,(Type *)(_kjCondition_1._32_8_ + 0x90));
      kj::_::Debug::Fault::~Fault(&local_148);
    }
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
              ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
               ((long)_kjDefer848.maybeFunc.ptr.field_1 + 0x50),(char *)_kjCondition_1._32_8_);
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::Maybe();
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::operator=
              ((Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
               (_kjCondition_1._32_8_ + 0x78),&local_150);
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Maybe(&local_150);
    kj::_::XThreadEvent::setDisconnected((XThreadEvent *)_kjCondition_1._32_8_);
    kj::_::XThreadEvent::sendReply((XThreadEvent *)_kjCondition_1._32_8_);
    kj::_::XThreadEvent::setDoneState((XThreadEvent *)_kjCondition_1._32_8_);
    ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::
    operator++((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                *)&__end2_1.next);
  }
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::begin
            ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)&__end2_2.next);
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::end
            ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)&event_2);
  while (bVar1 = ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                 ::operator==((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                               *)&__end2_2.next,
                              (ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                               *)&event_2), ((bVar1 ^ 0xffU) & 1) != 0) {
    _kjCondition_2._32_8_ =
         ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::
         operator*((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                    *)&__end2_2.next);
    local_1b8 = (Type *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                   &((XThreadEvent *)_kjCondition_2._32_8_)->state);
    f_2.exception._4_4_ = 3;
    kj::_::DebugExpression<kj::_::XThreadEvent::{unnamed_type#1}&>::operator==
              ((DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
                *)local_1b0,(DebugExpression<kj::_::XThreadEvent::_unnamed_type_1_&> *)&local_1b8,
               (Type *)((long)&f_2.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadEvent::_unnamed_type_1_&,_unnamed_type_1_>&,kj::_::XThreadEvent::_unnamed_type_1_>
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x364,FAILED,"event.state == _::XThreadEvent::CANCELING",
                 "_kjCondition,event.state",
                 (DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
                  *)local_1b0,(Type *)(_kjCondition_2._32_8_ + 0x90));
      kj::_::Debug::Fault::~Fault(&local_1c8);
    }
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
              ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
               ((long)_kjDefer848.maybeFunc.ptr.field_1 + 0x20),(char *)_kjCondition_2._32_8_);
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::Maybe();
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::operator=
              ((Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
               (_kjCondition_2._32_8_ + 0x78),
               (Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
               &stack0xfffffffffffffe30);
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Maybe
              ((Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
               &stack0xfffffffffffffe30);
    kj::_::XThreadEvent::setDoneState((XThreadEvent *)_kjCondition_2._32_8_);
    ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::
    operator++((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>
                *)&__end2_2.next);
  }
  bVar1 = List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::empty
                    ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink> *)
                     ((long)_kjDefer848.maybeFunc.ptr.field_1 + 0x38));
  if (!bVar1) {
    __range3._6_1_ = kj::_::Debug::shouldLog(ERROR);
    while (__range3._6_1_ != false) {
      kj::_::Debug::log<char_const(&)[64]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x36d,ERROR,"\"EventLoop destroyed with cross-thread event replies outstanding\"",
                 (char (*) [64])"EventLoop destroyed with cross-thread event replies outstanding");
      __range3._6_1_ = false;
    }
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::begin
              ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink> *)&__end3.next);
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::end
              ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink> *)&event_3);
    while (bVar1 = ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>
                   ::operator==((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>
                                 *)&__end3.next,
                                (ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>
                                 *)&event_3), ((bVar1 ^ 0xffU) & 1) != 0) {
      __filename = ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>
                   ::operator*((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>
                                *)&__end3.next);
      List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::remove
                ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink> *)
                 ((long)_kjDefer848.maybeFunc.ptr.field_1 + 0x38),(char *)__filename);
      ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::
      operator++((ListIterator<kj::_::XThreadEvent,_kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>
                  *)&__end3.next);
    }
  }
  bVar1 = List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::empty
                    ((List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *)
                     ((long)_kjDefer848.maybeFunc.ptr.field_1 + 0x68));
  if (!bVar1) {
    __range3_1._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (__range3_1._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[68]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x375,ERROR,
                 "\"EventLoop destroyed with cross-thread fulfiller replies outstanding\"",
                 (char (*) [68])
                 "EventLoop destroyed with cross-thread fulfiller replies outstanding");
      __range3_1._7_1_ = false;
    }
    List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::begin
              ((List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *)&__end3_1.next);
    List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::end
              ((List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *)&event_4);
    while (bVar1 = ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::
                   operator==((ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>
                               *)&__end3_1.next,
                              (ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>
                               *)&event_4), ((bVar1 ^ 0xffU) & 1) != 0) {
      __filename_00 =
           ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::operator*
                     ((ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>
                       *)&__end3_1.next);
      List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::remove
                ((List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *)
                 ((long)_kjDefer848.maybeFunc.ptr.field_1 + 0x68),(char *)__filename_00);
      __filename_00->state = DISPATCHED;
      ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::operator++
                ((ListIterator<kj::_::XThreadPaf,_kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *)
                 &__end3_1.next);
    }
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:848:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:848:5)>
               *)local_60);
  return;
}

Assistant:

void disconnect() {
    state.lockExclusive()->loop = kj::none;

    // Now that `loop` is set null in `state`, other threads will no longer try to manipulate our
    // lists, so we can access them without a lock. That's convenient because a bunch of the things
    // we want to do with them would require dropping the lock to avoid deadlocks. We'd end up
    // copying all the lists over into separate vectors first, dropping the lock, operating on
    // them, and then locking again.
    auto& s = state.getWithoutLock();

    // We do, however, take and release the lock on the way out, to make sure anyone performing
    // a conditional wait for state changes gets a chance to have their wait condition re-checked.
    KJ_DEFER(state.lockExclusive());

    for (auto& event: s.start) {
      KJ_ASSERT(event.state == _::XThreadEvent::QUEUED, event.state) { break; }
      s.start.remove(event);
      event.setDisconnected();
      event.sendReply();
      event.setDoneState();
    }

    for (auto& event: s.executing) {
      KJ_ASSERT(event.state == _::XThreadEvent::EXECUTING, event.state) { break; }
      s.executing.remove(event);
      event.promiseNode = kj::none;
      event.setDisconnected();
      event.sendReply();
      event.setDoneState();
    }

    for (auto& event: s.cancel) {
      KJ_ASSERT(event.state == _::XThreadEvent::CANCELING, event.state) { break; }
      s.cancel.remove(event);
      event.promiseNode = kj::none;
      event.setDoneState();
    }

    // The replies list "should" be empty, because any locally-initiated tasks should have been
    // canceled before destroying the EventLoop.
    if (!s.replies.empty()) {
      KJ_LOG(ERROR, "EventLoop destroyed with cross-thread event replies outstanding");
      for (auto& event: s.replies) {
        s.replies.remove(event);
      }
    }

    // Similarly for cross-thread fulfillers. The waiting tasks should have been canceled.
    if (!s.fulfilled.empty()) {
      KJ_LOG(ERROR, "EventLoop destroyed with cross-thread fulfiller replies outstanding");
      for (auto& event: s.fulfilled) {
        s.fulfilled.remove(event);
        event.state = _::XThreadPaf::DISPATCHED;
      }
    }
  }